

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O0

DdNode * cuddZddGetNodeIVO(DdManager *dd,int index,DdNode *g,DdNode *h)

{
  DdNode *f_00;
  DdNode *P;
  DdNode *zdd_zero;
  DdNode *zdd_one;
  DdNode *t;
  DdNode *r;
  DdNode *f;
  DdNode *h_local;
  DdNode *g_local;
  int index_local;
  DdManager *dd_local;
  
  f_00 = cuddUniqueInterZdd(dd,index,dd->one,dd->zero);
  if (f_00 == (DdNode *)0x0) {
    dd_local = (DdManager *)0x0;
  }
  else {
    *(int *)(((ulong)f_00 & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)f_00 & 0xfffffffffffffffe) + 4) + 1;
    P = cuddZddProduct(dd,f_00,g);
    if (P == (DdNode *)0x0) {
      Cudd_RecursiveDerefZdd(dd,f_00);
      dd_local = (DdManager *)0x0;
    }
    else {
      *(int *)(((ulong)P & 0xfffffffffffffffe) + 4) =
           *(int *)(((ulong)P & 0xfffffffffffffffe) + 4) + 1;
      Cudd_RecursiveDerefZdd(dd,f_00);
      dd_local = (DdManager *)cuddZddUnion(dd,P,h);
      if (dd_local == (DdManager *)0x0) {
        Cudd_RecursiveDerefZdd(dd,P);
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) + 1;
        Cudd_RecursiveDerefZdd(dd,P);
        *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)dd_local & 0xfffffffffffffffe) + 4) + -1;
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
cuddZddGetNodeIVO(
  DdManager * dd,
  int  index,
  DdNode * g,
  DdNode * h)
{
    DdNode      *f, *r, *t;
    DdNode      *zdd_one = DD_ONE(dd);
    DdNode      *zdd_zero = DD_ZERO(dd);

    f = cuddUniqueInterZdd(dd, index, zdd_one, zdd_zero);
    if (f == NULL) {
        return(NULL);
    }
    cuddRef(f);
    t = cuddZddProduct(dd, f, g);
    if (t == NULL) {
        Cudd_RecursiveDerefZdd(dd, f);
        return(NULL);
    }
    cuddRef(t);
    Cudd_RecursiveDerefZdd(dd, f);
    r = cuddZddUnion(dd, t, h);
    if (r == NULL) {
        Cudd_RecursiveDerefZdd(dd, t);
        return(NULL);
    }
    cuddRef(r);
    Cudd_RecursiveDerefZdd(dd, t);

    cuddDeref(r);
    return(r);

}